

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

void Bmc_CexPerformUnrollingTest(Gia_Man_t *p,Abc_Cex_t *pCex)

{
  int iVar1;
  Gia_Man_t *p_00;
  long lVar2;
  int level;
  long lVar3;
  timespec ts;
  timespec local_28;
  
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar2 = 1;
  }
  else {
    lVar2 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_28.tv_nsec),8);
    lVar2 = ((lVar2 >> 7) - (lVar2 >> 0x3f)) + local_28.tv_sec * -1000000;
  }
  p_00 = Bmc_CexPerformUnrolling(p,pCex);
  Gia_ManPrintStats(p_00,(Gps_Par_t *)0x0);
  Gia_AigerWrite(p_00,"unroll.aig",0,0,0);
  Gia_ManStop(p_00);
  puts("CE-induced network is written into file \"unroll.aig\".");
  level = 3;
  iVar1 = clock_gettime(3,&local_28);
  if (iVar1 < 0) {
    lVar3 = -1;
  }
  else {
    lVar3 = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  }
  Abc_Print(level,"%s =","Time");
  Abc_Print(level,"%9.2f sec\n",(double)(lVar3 + lVar2) / 1000000.0);
  return;
}

Assistant:

void Bmc_CexPerformUnrollingTest( Gia_Man_t * p, Abc_Cex_t * pCex )
{
    Gia_Man_t * pNew;
    abctime clk = Abc_Clock();
    pNew = Bmc_CexPerformUnrolling( p, pCex );
    Gia_ManPrintStats( pNew, NULL );
    Gia_AigerWrite( pNew, "unroll.aig", 0, 0, 0 );
//Bmc_CexDumpAogStats( pNew, Abc_Clock() - clk );
    Gia_ManStop( pNew );
    printf( "CE-induced network is written into file \"unroll.aig\".\n" );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}